

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O0

void __thiscall
DumpMetaArrayVal<signed_char>::operator()
          (DumpMetaArrayVal<signed_char> *this,PtexMetaData *meta,char *key)

{
  ostream *poVar1;
  undefined8 in_RDX;
  long *in_RSI;
  int i;
  int count;
  char *val;
  int local_28;
  int local_24;
  long local_20 [4];
  
  local_20[0] = 0;
  local_24 = 0;
  (**(code **)(*in_RSI + 0x40))(in_RSI,in_RDX,local_20,&local_24);
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    if ((local_28 % 10 == 0) && ((local_28 != 0 || (10 < local_24)))) {
      std::operator<<((ostream *)&std::cout,"\n  ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"  ");
    std::operator<<(poVar1,(int)*(char *)(local_20[0] + local_28));
  }
  return;
}

Assistant:

void operator()(PtexMetaData* meta, const char* key)
    {
        const T* val=0;
        int count=0;
        meta->getValue(key, val, count);
        for (int i = 0; i < count; i++) {
            if (i%10==0 && (i || count > 10)) std::cout << "\n  ";
            std::cout <<  "  " << val[i];
        }
    }